

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFillAreaStyleHatching::IfcFillAreaStyleHatching
          (IfcFillAreaStyleHatching *this)

{
  *(undefined ***)&this->field_0x70 = &PTR__Object_007fca00;
  *(undefined8 *)&this->field_0x78 = 0;
  *(char **)&this->field_0x80 = "IfcFillAreaStyleHatching";
  IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
            (&this->super_IfcGeometricRepresentationItem,&PTR_construction_vtable_24__0086efa8);
  *(undefined8 *)&(this->super_IfcGeometricRepresentationItem).field_0x28 = 0;
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x86ef18;
  *(undefined8 *)&this->field_0x70 = 0x86ef90;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x86ef40;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x86ef68;
  (this->PatternStart).ptr.obj = (LazyObject *)0x0;
  (this->PatternStart).have = false;
  *(undefined8 *)&(this->super_IfcGeometricRepresentationItem).field_0x30 = 0;
  (this->StartOfNextHatchLine).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->StartOfNextHatchLine).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->PointOfReferenceHatchLine).ptr.obj = (LazyObject *)0x0;
  (this->PointOfReferenceHatchLine).have = false;
  return;
}

Assistant:

IfcFillAreaStyleHatching() : Object("IfcFillAreaStyleHatching") {}